

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

void __thiscall
cfd::core::Address::DecodeAddress
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  uint8_t *puVar1;
  AddressFormatData *this_00;
  uint8_t uVar2;
  pointer pcVar3;
  pointer puVar4;
  _Alloc_hider _Var5;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *pvVar6;
  uint8_t uVar7;
  WitnessVersion WVar8;
  AddressType AVar9;
  NetType_conflict NVar10;
  int iVar11;
  value_type_conflict *__val;
  long lVar12;
  CfdException *pCVar13;
  uint8_t *puVar14;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var15;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var16;
  Address *pAVar17;
  bool bVar18;
  int ret;
  Script script;
  size_t written;
  string segwit_prefix;
  string bs58;
  int local_12c;
  undefined1 local_128 [56];
  size_t local_f0;
  string local_e8;
  string local_c8;
  Address *local_a8;
  NetType_conflict local_9c;
  char *local_98;
  long local_90;
  char local_88 [16];
  char *local_78;
  ulong local_70;
  char local_68 [16];
  undefined1 local_58 [32];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_38;
  
  local_a8 = this;
  if ((DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
       ::kBech32Separator_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                    ::kBech32Separator_abi_cxx11_), iVar11 != 0)) {
    DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
    ::kBech32Separator_abi_cxx11_._M_dataplus._M_p =
         (pointer)&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                   ::kBech32Separator_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                ::kBech32Separator_abi_cxx11_,"1","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                  ::kBech32Separator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                         ::kBech32Separator_abi_cxx11_);
  }
  local_78 = local_68;
  pcVar3 = (address_string->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + address_string->_M_string_length);
  local_98 = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  p_Var15 = DAT_006bbc70;
  local_12c = -1;
  local_38 = network_parameters;
  if (network_parameters ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    if (kBitcoinAddressFormatList != DAT_006bbc70) {
      p_Var16 = kBitcoinAddressFormatList;
      do {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_c8,(AddressFormatData *)p_Var16);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,&local_c8,
                         &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                          ::kBech32Separator_abi_cxx11_);
        lVar12 = ::std::__cxx11::string::find((char *)&local_78,local_128._0_8_,0);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if (lVar12 == 0) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_
                    ((string *)local_128,(AddressFormatData *)p_Var16);
          ::std::__cxx11::string::operator=((string *)&local_98,(string *)local_128);
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_a8->format_data_,p_Var16);
          break;
        }
        p_Var16 = p_Var16 + 1;
      } while (p_Var16 != p_Var15);
    }
  }
  else {
    p_Var15 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(network_parameters->
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    p_Var16 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(network_parameters->
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var15 != p_Var16) {
      do {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_c8,(AddressFormatData *)p_Var15);
        if (local_c8._M_string_length == 0) {
          bVar18 = false;
        }
        else {
          AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_e8,(AddressFormatData *)p_Var15);
          if (local_e8._M_string_length < local_70) {
            AddressFormatData::GetBech32Hrp_abi_cxx11_
                      ((string *)local_58,(AddressFormatData *)p_Var15);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128,(string *)local_58,
                             &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                              ::kBech32Separator_abi_cxx11_);
            lVar12 = ::std::__cxx11::string::find((char *)&local_78,local_128._0_8_,0);
            if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
              operator_delete((void *)local_128._0_8_);
            }
            bVar18 = lVar12 == 0;
            if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
              operator_delete((void *)local_58._0_8_);
            }
          }
          else {
            bVar18 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if (bVar18) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_
                    ((string *)local_128,(AddressFormatData *)p_Var15);
          ::std::__cxx11::string::operator=((string *)&local_98,(string *)local_128);
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_a8->format_data_,p_Var15);
          break;
        }
        p_Var15 = p_Var15 + 1;
      } while (p_Var15 != p_Var16);
    }
  }
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8._M_dataplus._M_p = (pointer)operator_new(0x80);
  pvVar6 = local_38;
  pAVar17 = local_a8;
  local_e8._M_string_length = (size_type)((uchar *)local_e8._M_dataplus._M_p + 0x80);
  ((uchar *)local_e8._M_dataplus._M_p)[0x70] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x71] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x72] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x73] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x74] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x75] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x76] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x77] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x78] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x79] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x7a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x7b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x7c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x7d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x7e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x7f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x60] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x61] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x62] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[99] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[100] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x65] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x66] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x67] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x68] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x69] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x6a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x6b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x6c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x6d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x6e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x6f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x50] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x51] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x52] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x53] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x54] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x55] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x56] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x57] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x58] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x59] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x5a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x5b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x5c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x5d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x5e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x5f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x40] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x41] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x42] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x43] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x44] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x45] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x46] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x47] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x48] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x49] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x4a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x4b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x4c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x4d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x4e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x4f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x30] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x31] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x32] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x33] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x34] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x35] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x36] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x37] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x38] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x39] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x3a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x3b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x3c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x3d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x3e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x3f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x20] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x21] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x22] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x23] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x24] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x25] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x26] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x27] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x28] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x29] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x2a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x2b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x2c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x2d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x2e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x2f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x10] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x11] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x12] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x13] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x14] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x15] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x16] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x17] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x18] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x19] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x1a] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x1b] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x1c] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x1d] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x1e] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0x1f] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[1] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[2] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[3] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[4] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[5] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[6] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[7] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[8] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[9] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[10] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0xb] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0xc] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0xd] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0xe] = '\0';
  ((uchar *)local_e8._M_dataplus._M_p)[0xf] = '\0';
  local_f0 = 0;
  local_e8.field_2._M_allocated_capacity = local_e8._M_string_length;
  if (local_90 == 0) {
    local_12c = wally_base58_to_bytes(local_78,1,(uchar *)local_e8._M_dataplus._M_p,0x80,&local_f0);
    if (local_12c != 0) {
      local_128._0_8_ = "cfdcore_address.cpp";
      local_128._8_4_ = 1099;
      local_128._16_8_ = "DecodeAddress";
      logger::log<int&>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                        "wally_base58_to_bytes error. ret={}.",&local_12c);
      iVar11 = local_12c;
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      local_128._0_8_ = local_128 + 0x10;
      if (iVar11 != -2) {
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,"Base58 decode error.","");
        CfdException::CfdException(pCVar13,kCfdInternalError,(string *)local_128);
        __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"Base58 decode error.","");
      CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_128);
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,local_f0);
    p_Var15 = DAT_006bbc70;
    p_Var16 = kBitcoinAddressFormatList;
    if (pvVar6 == (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)0x0) {
      for (; p_Var16 != p_Var15; p_Var16 = p_Var16 + 1) {
        uVar2 = *local_e8._M_dataplus._M_p;
        uVar7 = AddressFormatData::GetP2shPrefix((AddressFormatData *)p_Var16);
        if (uVar2 == uVar7) {
          if (1 < pAVar17->addr_type_ - kP2shP2wshAddress) {
            pAVar17->addr_type_ = kP2shAddress;
          }
LAB_00435a28:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&pAVar17->format_data_,p_Var16);
          goto LAB_00435a37;
        }
        uVar2 = *local_e8._M_dataplus._M_p;
        uVar7 = AddressFormatData::GetP2pkhPrefix((AddressFormatData *)p_Var16);
        if (uVar2 == uVar7) {
          pAVar17->addr_type_ = kP2pkhAddress;
          goto LAB_00435a28;
        }
      }
    }
    else {
      p_Var16 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pvVar6->
                   super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var15 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(pvVar6->
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        )._M_impl.super__Vector_impl_data._M_start; p_Var15 != p_Var16;
          p_Var15 = p_Var15 + 1) {
        uVar2 = *local_e8._M_dataplus._M_p;
        uVar7 = AddressFormatData::GetP2shPrefix((AddressFormatData *)p_Var15);
        if (uVar2 == uVar7) {
          if (1 < pAVar17->addr_type_ - kP2shP2wshAddress) {
            pAVar17->addr_type_ = kP2shAddress;
          }
LAB_0043599b:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&pAVar17->format_data_,p_Var15);
LAB_00435a37:
          pAVar17->witness_ver_ = kVersionNone;
          puVar1 = (uint8_t *)(local_e8._M_dataplus._M_p + 1);
          if (puVar1 != (uint8_t *)local_e8._M_string_length) {
            memmove(local_e8._M_dataplus._M_p,puVar1,local_e8._M_string_length - (long)puVar1);
          }
          local_e8._M_string_length = local_e8._M_string_length + -1;
          goto LAB_00435a67;
        }
        uVar2 = *local_e8._M_dataplus._M_p;
        uVar7 = AddressFormatData::GetP2pkhPrefix((AddressFormatData *)p_Var15);
        if (uVar2 == uVar7) {
          pAVar17->addr_type_ = kP2pkhAddress;
          goto LAB_0043599b;
        }
      }
    }
    local_128._0_8_ = "cfdcore_address.cpp";
    local_128._8_4_ = 0x474;
    local_128._16_8_ = "DecodeAddress";
    logger::log<>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"Unknown address prefix.");
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._0_8_ = local_128 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Unknown address prefix.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_128);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_12c = wally_addr_segwit_to_bytes
                        (local_78,local_98,0,(uchar *)local_e8._M_dataplus._M_p,0x80,&local_f0);
  if (local_12c != 0) {
    local_128._0_8_ = "cfdcore_address.cpp";
    local_128._8_4_ = 0x425;
    local_128._16_8_ = "DecodeAddress";
    logger::log<int&>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                      "wally_addr_segwit_to_bytes error. ret={}.",&local_12c);
    iVar11 = local_12c;
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._0_8_ = local_128 + 0x10;
    if (iVar11 != -2) {
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"Segwit-address decode error.","");
      CfdException::CfdException(pCVar13,kCfdInternalError,(string *)local_128);
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Segwit-address decode error.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_128);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,local_f0);
  ByteData::ByteData((ByteData *)&local_c8,(uint8_t *)local_e8._M_dataplus._M_p,(uint32_t)local_f0);
  Script::Script((Script *)local_128,(ByteData *)&local_c8);
  if (local_c8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  bVar18 = Script::IsWitnessProgram((Script *)local_128);
  if (!bVar18) {
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"address decode check error.","");
    CfdException::CfdException(pCVar13,kCfdInternalError,&local_c8);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar8 = Script::GetWitnessVersion((Script *)local_128);
  _Var5._M_p = local_e8._M_dataplus._M_p;
  pAVar17->witness_ver_ = WVar8;
  if (WVar8 == kVersion0) {
    if (local_f0 == 0x16) {
      AVar9 = kP2wpkhAddress;
    }
    else {
      if (local_f0 != 0x22) goto LAB_004359ce;
      AVar9 = kP2wshAddress;
    }
  }
  else {
    if (WVar8 != kVersion1) goto LAB_004359ce;
    AVar9 = kTaprootAddress;
    if (local_f0 != 0x22) {
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"segwit v1 address decode check error.","");
      CfdException::CfdException(pCVar13,kCfdInternalError,&local_c8);
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  pAVar17->addr_type_ = AVar9;
LAB_004359ce:
  puVar1 = (uint8_t *)(local_e8._M_dataplus._M_p + 2);
  puVar14 = puVar1;
  if (local_e8._M_string_length - (long)puVar1 != 0) {
    memmove(local_e8._M_dataplus._M_p,puVar1,local_e8._M_string_length - (long)puVar1);
    puVar14 = (uint8_t *)local_e8._M_string_length;
  }
  if (puVar14 != (uint8_t *)(_Var5._M_p + ((long)puVar14 - (long)puVar1))) {
    local_e8._M_string_length = (size_type)(_Var5._M_p + ((long)puVar14 - (long)puVar1));
  }
  Script::~Script((Script *)local_128);
  pAVar17 = local_a8;
LAB_00435a67:
  ByteData::ByteData((ByteData *)local_128,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
  puVar4 = (pAVar17->hash_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pAVar17->hash_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
  (pAVar17->hash_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  (pAVar17->hash_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = (pointer)0x0;
  if ((puVar4 != (pointer)0x0) &&
     (operator_delete(puVar4), (pointer)local_128._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_128._0_8_);
  }
  if (pAVar17->witness_ver_ == kVersion1) {
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_128,&pAVar17->hash_);
    puVar4 = (pAVar17->schnorr_pubkey_).data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pAVar17->schnorr_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
    (pAVar17->schnorr_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
    (pAVar17->schnorr_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    if ((puVar4 != (pointer)0x0) &&
       (operator_delete(puVar4), (pointer)local_128._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  this_00 = &pAVar17->format_data_;
  NVar10 = AddressFormatData::GetNetType(this_00);
  pAVar17->type_ = NVar10;
  local_58._0_8_ = "cfdcore_address.cpp";
  local_58._8_4_ = 0x482;
  local_58._16_8_ = "DecodeAddress";
  local_9c = AddressFormatData::GetNetType(this_00);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"nettype","");
  AddressFormatData::GetString((string *)local_128,this_00,&local_c8);
  logger::log<cfd::core::NetType&,std::__cxx11::string&>
            ((CfdSourceLocation *)local_58,kCfdLogLevelInfo,"DecodeAddress nettype={},{}",&local_9c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((uint8_t *)local_e8._M_dataplus._M_p != (uint8_t *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void Address::DecodeAddress(
    std::string address_string,
    const std::vector<AddressFormatData>* network_parameters) {
  static const std::string kBech32Separator = "1";
  static const auto StartsWith = [](const std::string& message,
                                    const std::string& bech32_hrp) -> bool {
    return (message.find(bech32_hrp + kBech32Separator) == 0);
  };

  std::string bs58 = address_string;
  std::string segwit_prefix = "";
  int ret = -1;

  if (network_parameters != nullptr) {
    for (const AddressFormatData& param : *network_parameters) {
      // Custom parameter
      if ((!param.GetBech32Hrp().empty()) &&
          (param.GetBech32Hrp().length() < bs58.length()) &&
          (StartsWith(bs58, param.GetBech32Hrp()))) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  } else {
    for (const auto& param : kBitcoinAddressFormatList) {
      if (StartsWith(bs58, param.GetBech32Hrp())) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  }

  std::vector<uint8_t> data_part(128);
  size_t written = 0;

  if (!segwit_prefix.empty()) {
    // Bech32 Address
    ret = wally_addr_segwit_to_bytes(
        bs58.data(), segwit_prefix.data(), 0, data_part.data(),
        data_part.size(), &written);

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_addr_segwit_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(
            kCfdIllegalArgumentError, "Segwit-address decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Segwit-address decode error.");
      }
    }

    data_part.resize(written);
    Script script(ByteData(data_part.data(), static_cast<uint32_t>(written)));
    if (!script.IsWitnessProgram()) {
      throw CfdException(kCfdInternalError, "address decode check error.");
    }
    witness_ver_ = script.GetWitnessVersion();

    if (witness_ver_ == kVersion1) {
      if (written != (SchnorrPubkey::kSchnorrPubkeySize + 2)) {
        throw CfdException(
            kCfdInternalError, "segwit v1 address decode check error.");
      }
      SetAddressType(kTaprootAddress);
    } else if (witness_ver_ == kVersion0) {
      if (written == kScriptHashP2wpkhLength) {
        SetAddressType(kP2wpkhAddress);
      } else if (written == kScriptHashP2wshLength) {
        SetAddressType(kP2wshAddress);
      }
    }

    // Delete 0byte:WitnessVersion and 1byte:data_part
    data_part.erase(data_part.begin(), data_part.begin() + 2);

  } else {
    ret = wally_base58_to_bytes(
        bs58.data(), BASE58_FLAG_CHECKSUM, data_part.data(), data_part.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(kCfdIllegalArgumentError, "Base58 decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Base58 decode error.");
      }
    }

    data_part.resize(written);

    bool find_address_type = false;
    if (network_parameters != nullptr) {
      for (const AddressFormatData& param : *network_parameters) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    } else {
      for (const auto& param : kBitcoinAddressFormatList) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    }
    if (!find_address_type) {
      warn(CFD_LOG_SOURCE, "Unknown address prefix.");
      throw CfdException(kCfdIllegalArgumentError, "Unknown address prefix.");
    }
    witness_ver_ = kVersionNone;

    // Delete 0byte:prefix.
    data_part.erase(data_part.begin());
  }

  // Setting for Hash.
  hash_ = ByteData(data_part);
  if (witness_ver_ == kVersion1) schnorr_pubkey_ = SchnorrPubkey(hash_);
  SetNetType(format_data_);
  info(
      CFD_LOG_SOURCE, "DecodeAddress nettype={},{}", format_data_.GetNetType(),
      format_data_.GetString(kNettype));
}